

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O2

int read_png(control *control)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int extraout_EAX;
  png_structp ppVar7;
  png_infop ppVar8;
  long lVar9;
  int iVar10;
  int rc;
  png_infop info_ptr;
  png_infop local_48;
  control *local_40;
  png_structp png_ptr;
  
  info_ptr = (png_infop)0x0;
  ppVar7 = (png_structp)png_create_read_struct("1.6.48.git",control,error_handler,warning_handler);
  png_ptr = ppVar7;
  if (ppVar7 == (png_structp)0x0) {
    log_error(&control->file,2,"OOM allocating png_struct");
    piVar1 = &(control->file).status_code;
    *(byte *)piVar1 = (byte)*piVar1 | 0x40;
    iVar4 = extraout_EAX;
  }
  else {
    iVar4 = _setjmp((__jmp_buf_tag *)(control->file).jmpbuf);
    if (iVar4 == 0) {
      png_set_user_limits(ppVar7,0x7fffffff);
      png_set_chunk_cache_max(ppVar7,0);
      png_set_chunk_malloc_max(ppVar7,0);
      png_set_read_fn(ppVar7,control,read_callback);
      ppVar8 = (png_infop)png_create_info_struct(ppVar7);
      info_ptr = ppVar8;
      if (ppVar8 == (png_infop)0x0) {
        iVar4 = 0x1086f9;
        png_error();
        lVar2 = *(long *)(ppVar7 + 0x150);
        if (iVar4 == 0) {
          if (*(long *)(ppVar7 + 0x140) != 0) {
            __assert_fail("file->chunk == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                          ,0xdde,"void allocate(struct file *, int)");
          }
          clear((void *)(lVar2 + 0x160),0x58);
          *(png_structp *)(lVar2 + 0x160) = ppVar7;
          *(long *)(lVar2 + 0x168) = *(long *)ppVar7;
          lVar9 = *(long *)(ppVar7 + 0x120);
          *(long *)(lVar2 + 400) = *(long *)(ppVar7 + 0x118);
          *(long *)(lVar2 + 0x198) = lVar9;
          lVar9 = *(long *)(ppVar7 + 0x128);
          *(long *)(lVar2 + 0x1a0) = lVar9;
          *(undefined4 *)(lVar2 + 0x17c) = 0;
          *(undefined4 *)(lVar2 + 0x18c) = 0;
          *(void **)(ppVar7 + 0x140) = (void *)(lVar2 + 0x160);
        }
        else {
          if (*(long *)(ppVar7 + 0x148) != 0) {
            __assert_fail("file->idat == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                          ,0xdd8,"void allocate(struct file *, int)");
          }
          if (*(long *)(ppVar7 + 0x140) != 0) {
            __assert_fail("file->chunk == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                          ,0x6fd,"void IDAT_init(struct IDAT *const, struct file *const)");
          }
          clear((void *)(lVar2 + 0x1b8),0x38);
          *(png_structp *)(lVar2 + 0x1b8) = ppVar7;
          lVar9 = *(long *)ppVar7;
          *(long *)(lVar2 + 0x1c0) = lVar9;
          *(undefined4 *)(lVar9 + 0x1c) = 0;
          *(long *)(lVar2 + 0x1d0) = lVar9 + 0x10;
          *(long *)(lVar2 + 0x1c8) = lVar9 + 0x10;
          lVar9 = (**(code **)(ppVar7 + 0x158))(ppVar7,0);
          if (*(long *)(ppVar7 + 0x140) == 0) {
            __assert_fail("file->chunk != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                          ,0x70f,"void IDAT_init(struct IDAT *const, struct file *const)");
          }
          *(void **)(ppVar7 + 0x148) = (void *)(lVar2 + 0x1b8);
        }
        return (int)lVar9;
      }
      local_40 = control;
      if ((undefined1  [96])((undefined1  [96])*(control->file).global & (undefined1  [96])0xe0) !=
          (undefined1  [96])0x0) {
        fwrite(" INFO\n",6,1,_stderr);
      }
      png_read_info(ppVar7,ppVar8);
      local_48 = ppVar8;
      iVar5 = png_get_image_height(ppVar7,ppVar8);
      iVar6 = png_set_interlace_handling(ppVar7);
      png_start_read_image(ppVar7);
      iVar10 = 0;
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      for (; iVar3 = iVar5, iVar10 != iVar6; iVar10 = iVar10 + 1) {
        while (iVar3 != 0) {
          png_read_row(ppVar7,0);
          iVar3 = iVar3 + -1;
        }
      }
      if ((undefined1  [96])((undefined1  [96])*(local_40->file).global & (undefined1  [96])0xe0) !=
          (undefined1  [96])0x0) {
        fwrite(" END\n",5,1,_stderr);
      }
      png_read_end(ppVar7,local_48);
    }
    png_destroy_read_struct(&png_ptr,&info_ptr,0);
  }
  return iVar4;
}

Assistant:

static int
read_png(struct control *control)
   /* Read a PNG, return 0 on success else an error (status) code; a bit mask as
    * defined for file::status_code as above.
    */
{
   png_structp png_ptr;
   png_infop info_ptr = NULL;
   volatile int rc;

   png_ptr = png_create_read_struct(PNG_LIBPNG_VER_STRING, control,
      error_handler, warning_handler);

   if (png_ptr == NULL)
   {
      /* This is not really expected. */
      log_error(&control->file, LIBPNG_ERROR_CODE, "OOM allocating png_struct");
      control->file.status_code |= INTERNAL_ERROR;
      return LIBPNG_ERROR_CODE;
   }

   rc = setjmp(control->file.jmpbuf);
   if (rc == 0)
   {
#     ifdef PNG_SET_USER_LIMITS_SUPPORTED
         /* Remove any limits on the size of PNG files that can be read,
          * without this we may reject files based on built-in safety
          * limits.
          */
         png_set_user_limits(png_ptr, 0x7fffffff, 0x7fffffff);
         png_set_chunk_cache_max(png_ptr, 0);
         png_set_chunk_malloc_max(png_ptr, 0);
#     endif

      png_set_read_fn(png_ptr, control, read_callback);

      info_ptr = png_create_info_struct(png_ptr);
      if (info_ptr == NULL)
         png_error(png_ptr, "OOM allocating info structure");

      if (control->file.global->verbose)
         fprintf(stderr, " INFO\n");

      png_read_info(png_ptr, info_ptr);

      {
        png_uint_32 height = png_get_image_height(png_ptr, info_ptr);
        int passes = png_set_interlace_handling(png_ptr);
        int pass;

        png_start_read_image(png_ptr);

        for (pass = 0; pass < passes; ++pass)
        {
           png_uint_32 y = height;

           /* NOTE: this skips asking libpng to return either version of
            * the image row, but libpng still reads the rows.
            */
           while (y-- > 0)
              png_read_row(png_ptr, NULL, NULL);
        }
      }

      if (control->file.global->verbose)
         fprintf(stderr, " END\n");

      /* Make sure to read to the end of the file: */
      png_read_end(png_ptr, info_ptr);
   }

   png_destroy_read_struct(&png_ptr, &info_ptr, NULL);
   return rc;
}